

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

int call_orderTM(lua_State *L,TValue *p1,TValue *p2,TMS event)

{
  int iVar1;
  TValue *t1;
  TValue *t2;
  bool local_42;
  bool local_41;
  TValue *tm2;
  TValue *tm1;
  TMS event_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  t1 = luaT_gettmbyobj(L,p1,event);
  if (t1->tt == 0) {
    L_local._4_4_ = 0xffffffff;
  }
  else {
    t2 = luaT_gettmbyobj(L,p2,event);
    iVar1 = luaO_rawequalObj(t1,t2);
    if (iVar1 == 0) {
      L_local._4_4_ = 0xffffffff;
    }
    else {
      callTMres(L,L->top,t1,p1,p2);
      local_41 = true;
      if (L->top->tt != 0) {
        local_42 = false;
        if (L->top->tt == 1) {
          local_42 = (L->top->value).b == 0;
        }
        local_41 = local_42;
      }
      L_local._4_4_ = (uint)((local_41 ^ 0xffU) & 1);
    }
  }
  return L_local._4_4_;
}

Assistant:

static int call_orderTM (lua_State *L, const TValue *p1, const TValue *p2,
                         TMS event) {
  const TValue *tm1 = luaT_gettmbyobj(L, p1, event);
  const TValue *tm2;
  if (ttisnil(tm1)) return -1;  /* no metamethod? */
  tm2 = luaT_gettmbyobj(L, p2, event);
  if (!luaO_rawequalObj(tm1, tm2))  /* different metamethods? */
    return -1;
  callTMres(L, L->top, tm1, p1, p2);
  return !l_isfalse(L->top);
}